

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDirWrapper.cpp
# Opt level: O2

void * __thiscall
DebugDirEntryWrapper::getFieldPtr(DebugDirEntryWrapper *this,size_t fId,size_t subField)

{
  int iVar1;
  IMAGE_DEBUG_DIRECTORY *pIVar2;
  undefined4 extraout_var;
  
  pIVar2 = debugDir(this);
  if (pIVar2 == (IMAGE_DEBUG_DIRECTORY *)0x0) {
    pIVar2 = (IMAGE_DEBUG_DIRECTORY *)0x0;
  }
  else {
    switch(fId) {
    case 0:
      break;
    case 1:
      pIVar2 = (IMAGE_DEBUG_DIRECTORY *)&pIVar2->TimeDateStamp;
      break;
    case 2:
      pIVar2 = (IMAGE_DEBUG_DIRECTORY *)&pIVar2->MajorVersion;
      break;
    case 3:
      pIVar2 = (IMAGE_DEBUG_DIRECTORY *)&pIVar2->MinorVersion;
      break;
    case 4:
      pIVar2 = (IMAGE_DEBUG_DIRECTORY *)&pIVar2->Type;
      break;
    case 5:
      pIVar2 = (IMAGE_DEBUG_DIRECTORY *)&pIVar2->SizeOfData;
      break;
    case 6:
      pIVar2 = (IMAGE_DEBUG_DIRECTORY *)&pIVar2->AddressOfRawData;
      break;
    case 7:
      pIVar2 = (IMAGE_DEBUG_DIRECTORY *)&pIVar2->PointerToRawData;
      break;
    default:
      iVar1 = (*(this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
                super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])(this);
      return (void *)CONCAT44(extraout_var,iVar1);
    }
  }
  return pIVar2;
}

Assistant:

void* DebugDirEntryWrapper::getFieldPtr(size_t fId, size_t subField)
{
    IMAGE_DEBUG_DIRECTORY* d = debugDir();
    if (d == NULL) return NULL;

    switch (fId) {
        case CHARACTERISTIC: return &d->Characteristics;
        case TIMESTAMP: return &d->TimeDateStamp;
        case MAJOR_VER: return &d->MajorVersion;
        case MINOR_VER: return &d->MinorVersion;
        case TYPE: return &d->Type;
        case DATA_SIZE: return &d->SizeOfData;
        case RAW_DATA_ADDR: return &d->AddressOfRawData;
        case RAW_DATA_PTR: return &d->PointerToRawData;
    }
    return this->getPtr();
}